

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

void returnStatement(object *proc,int retSize)

{
  item *x_00;
  item *x;
  int retSize_local;
  object *proc_local;
  
  x_00 = (item *)calloc(1,0x30);
  if (currentSymbol == 0xcb) {
    getSymbol();
  }
  else {
    expression(x_00);
    if (proc->retTypeIndex != x_00->typeIndex) {
      mark("wrong return type");
      exit(-1);
    }
    if (x_00->mode == 0x2bd) {
      put(0x10,0x1c,0,x_00->a);
    }
    else if (x_00->mode == 0x2c1) {
      put(0x20,0x1c,0x1d,x_00->a);
    }
    else if (x_00->mode == 0x2c6) {
      put(0x33,0x1c,x_00->r,x_00->a);
    }
    else if (x_00->mode == 0x2c2) {
      put(0,0x1c,0,x_00->r);
    }
    regs[x_00->r] = 0;
    ret(retSize);
    semicolon();
  }
  return;
}

Assistant:

procedure
void returnStatement(struct object *proc, int retSize)  {
	variable struct item *x;
	x = NULL;
	allocMem(x);
	if (currentSymbol == SYMBOL_SEMICOLON)  {
		getSymbol(); 
	} else  {
		expression(x);
		if (proc->retTypeIndex == x->typeIndex) {
			if (x->mode == CLASS_CONST) {
				put(RISC_ADDI, rv, 0, x->a);
			} elsif (x->mode == CLASS_VAR) {
				put(RISC_LDW, rv, fp, x->a);
			} elsif (x->mode == CLASS_IND) {
				put(RISC_HLDW, rv,x->r,x->a);
			} elsif (x->mode == CLASS_REG) {
				put(RISC_ADD, rv, 0, x->r);
			}
			regs[x->r] = 0; /* free x->r */
			ret(retSize);
		} else {
			mark("wrong return type");
			exit(-1);
		}
		semicolon();
	}
}